

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

bool QUtil::is_utf16(string *val)

{
  char *pcVar1;
  
  if (1 < val->_M_string_length) {
    pcVar1 = (val->_M_dataplus)._M_p;
    if (*pcVar1 == -1) {
      return pcVar1[1] == -2;
    }
    if ((*pcVar1 == -2) && (pcVar1[1] == -1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
QUtil::is_utf16(std::string const& val)
{
    return (
        (val.length() >= 2) &&
        (((val.at(0) == '\xfe') && (val.at(1) == '\xff')) ||
         ((val.at(0) == '\xff') && (val.at(1) == '\xfe'))));
}